

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Appearance_PDU::SetAppearanceEMFlag(Appearance_PDU *this,KBOOL F)

{
  KBOOL F_local;
  Appearance_PDU *this_local;
  
  if (F != (KBOOL)((this->m_AppearanceFlag2Union).m_ui8Flag & 1)) {
    (this->m_AppearanceFlag2Union).m_ui8Flag = (this->m_AppearanceFlag2Union).m_ui8Flag & 0xfe | F;
    if (F) {
      SetFlag2Flag(this,F);
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 4;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 4;
    }
  }
  return;
}

Assistant:

void Appearance_PDU::SetAppearanceEMFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag2Union.m_ui8EM )return;

    m_AppearanceFlag2Union.m_ui8EM = F;

    if( F )
    {
        SetFlag2Flag( F );
        m_ui16PDULength += EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
}